

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::selectAllInEditor(QAbstractItemViewPrivate *this,QWidget *editor)

{
  QLineEdit *pQVar1;
  QSpinBox *pQVar2;
  QDoubleSpinBox *pQVar3;
  QWidget *in_RSI;
  QDoubleSpinBox *dsb;
  QSpinBox *sb;
  QLineEdit *le;
  QWidget *fp;
  QWidget *in_stack_ffffffffffffffd0;
  QWidget *this_00;
  
  do {
    this_00 = in_RSI;
    in_RSI = QWidget::focusProxy(in_stack_ffffffffffffffd0);
  } while (in_RSI != (QWidget *)0x0);
  pQVar1 = qobject_cast<QLineEdit*>((QObject *)0x80984f);
  if (pQVar1 != (QLineEdit *)0x0) {
    QLineEdit::selectAll((QLineEdit *)in_stack_ffffffffffffffd0);
  }
  pQVar2 = qobject_cast<QSpinBox*>((QObject *)0x809870);
  if (pQVar2 == (QSpinBox *)0x0) {
    pQVar3 = qobject_cast<QDoubleSpinBox*>((QObject *)0x809893);
    if (pQVar3 != (QDoubleSpinBox *)0x0) {
      QAbstractSpinBox::selectAll((QAbstractSpinBox *)this_00);
    }
  }
  else {
    QAbstractSpinBox::selectAll((QAbstractSpinBox *)this_00);
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::selectAllInEditor(QWidget *editor)
{
    while (QWidget *fp = editor->focusProxy())
        editor = fp;

#if QT_CONFIG(lineedit)
    if (QLineEdit *le = qobject_cast<QLineEdit*>(editor))
        le->selectAll();
#endif
#if QT_CONFIG(spinbox)
    if (QSpinBox *sb = qobject_cast<QSpinBox*>(editor))
        sb->selectAll();
    else if (QDoubleSpinBox *dsb = qobject_cast<QDoubleSpinBox*>(editor))
        dsb->selectAll();
#endif
}